

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChGlyphs.cpp
# Opt level: O2

void __thiscall
chrono::ChGlyphs::SetGlyphCoordsys(ChGlyphs *this,uint id,ChCoordsys<double> *mcoord)

{
  ChCoordsys<double> *pCVar1;
  pointer pCVar2;
  pointer pCVar3;
  ulong uVar4;
  
  pCVar3 = (this->points).
           super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar4 = (ulong)id;
  if ((ulong)(((long)(this->points).
                     super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar3) / 0x18) <= uVar4) {
    std::vector<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>::resize
              (&this->points,(ulong)(id + 1));
    pCVar3 = (this->points).
             super__Vector_base<chrono::ChVector<double>,_std::allocator<chrono::ChVector<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  pCVar1 = (ChCoordsys<double> *)(pCVar3 + uVar4);
  if (pCVar1 != mcoord) {
    (pCVar1->pos).m_data[0] = (mcoord->pos).m_data[0];
    (pCVar1->pos).m_data[1] = (mcoord->pos).m_data[1];
    (pCVar1->pos).m_data[2] = (mcoord->pos).m_data[2];
  }
  pCVar2 = (this->rotations).
           super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if ((ulong)((long)(this->rotations).
                    super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish - (long)pCVar2 >> 5) <= uVar4) {
    std::vector<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>::
    resize(&this->rotations,(ulong)(id + 1));
    pCVar2 = (this->rotations).
             super__Vector_base<chrono::ChQuaternion<double>,_std::allocator<chrono::ChQuaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
  }
  ChQuaternion<double>::operator=(pCVar2 + uVar4,&mcoord->rot);
  return;
}

Assistant:

void ChGlyphs::SetGlyphCoordsys(unsigned int id, ChCoordsys<> mcoord) {
    if (points.size() <= id)
        points.resize(id + 1);
    points[id] = mcoord.pos;

    if (rotations.size() <= id)
        rotations.resize(id + 1);
    rotations[id] = mcoord.rot;
}